

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_event_loop.cpp
# Opt level: O0

void __thiscall timer::canceler::operator()(canceler *this,error_code *e)

{
  bool bVar1;
  ostream *poVar2;
  error_code *in_RSI;
  long in_RDI;
  
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Fail: ");
    poVar2 = std::operator<<(poVar2,"!e");
    poVar2 = std::operator<<(poVar2," at ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x70);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    return_code = 1;
  }
  booster::aio::io_service::cancel_timer_event((int)*(undefined8 *)(in_RDI + 8));
  return;
}

Assistant:

void operator()(booster::system::error_code const &e) const
		{
			TEST(!e);
			srv->cancel_timer_event(event_id);
		}